

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionObject.cpp
# Opt level: O1

char * __thiscall
btCollisionObject::serialize(btCollisionObject *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  btTransform *pbVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pbVar4 = &this->m_worldTransform;
  lVar6 = (long)dataBuffer + 0x20;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      *(btScalar *)(lVar6 + lVar8 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar7 != 3);
  lVar6 = 0xe;
  do {
    *(btScalar *)((long)dataBuffer + lVar6 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x12);
  pbVar4 = &this->m_interpolationWorldTransform;
  lVar6 = (long)dataBuffer + 0x60;
  lVar7 = 0;
  do {
    lVar8 = 0;
    do {
      *(btScalar *)(lVar6 + lVar8 * 4) = (pbVar4->m_basis).m_el[0].m_floats[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x10;
    pbVar4 = (btTransform *)((pbVar4->m_basis).m_el + 1);
  } while (lVar7 != 3);
  lVar6 = 0x1e;
  do {
    *(btScalar *)((long)dataBuffer + lVar6 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x22);
  lVar6 = 0x22;
  do {
    *(btScalar *)((long)dataBuffer + lVar6 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x26);
  lVar6 = 0x26;
  do {
    *(btScalar *)((long)dataBuffer + lVar6 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x2a);
  lVar6 = 0x2a;
  do {
    *(btScalar *)((long)dataBuffer + lVar6 * 4 + 0x18) =
         (this->m_worldTransform).m_basis.m_el[0].m_floats[lVar6 + -2];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x2e);
  *(int *)((long)dataBuffer + 0xf0) = this->m_hasAnisotropicFriction;
  *(btScalar *)((long)dataBuffer + 0xd0) = this->m_contactProcessingThreshold;
  *(undefined8 *)dataBuffer = 0;
  uVar5 = (**(code **)(*(long *)serializer + 0x38))(serializer,this->m_collisionShape);
  *(undefined8 *)((long)dataBuffer + 8) = uVar5;
  *(undefined8 *)((long)dataBuffer + 0x10) = 0;
  uVar5 = *(undefined8 *)&this->m_companionId;
  *(undefined8 *)((long)dataBuffer + 0xf4) = *(undefined8 *)&this->m_collisionFlags;
  *(undefined8 *)((long)dataBuffer + 0xfc) = uVar5;
  bVar1 = this->m_friction;
  bVar2 = this->m_restitution;
  bVar3 = this->m_rollingFriction;
  *(btScalar *)((long)dataBuffer + 0xd4) = this->m_deactivationTime;
  *(btScalar *)((long)dataBuffer + 0xd8) = bVar1;
  *(btScalar *)((long)dataBuffer + 0xdc) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xe0) = bVar2;
  *(int *)((long)dataBuffer + 0x104) = this->m_internalType;
  uVar5 = (**(code **)(*(long *)serializer + 0x50))(serializer,this);
  lVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,uVar5);
  *(long *)((long)dataBuffer + 0x18) = lVar6;
  if (lVar6 != 0) {
    (**(code **)(*(long *)serializer + 0x60))(serializer,uVar5);
  }
  *(undefined8 *)((long)dataBuffer + 0xe4) = *(undefined8 *)&this->m_hitFraction;
  *(btScalar *)((long)dataBuffer + 0xec) = this->m_ccdMotionThreshold;
  *(int *)((long)dataBuffer + 0x108) = this->m_checkCollideWith;
  return "btCollisionObjectFloatData";
}

Assistant:

const char* btCollisionObject::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btCollisionObjectData* dataOut = (btCollisionObjectData*)dataBuffer;

	m_worldTransform.serialize(dataOut->m_worldTransform);
	m_interpolationWorldTransform.serialize(dataOut->m_interpolationWorldTransform);
	m_interpolationLinearVelocity.serialize(dataOut->m_interpolationLinearVelocity);
	m_interpolationAngularVelocity.serialize(dataOut->m_interpolationAngularVelocity);
	m_anisotropicFriction.serialize(dataOut->m_anisotropicFriction);
	dataOut->m_hasAnisotropicFriction = m_hasAnisotropicFriction;
	dataOut->m_contactProcessingThreshold = m_contactProcessingThreshold;
	dataOut->m_broadphaseHandle = 0;
	dataOut->m_collisionShape = serializer->getUniquePointer(m_collisionShape);
	dataOut->m_rootCollisionShape = 0;//@todo
	dataOut->m_collisionFlags = m_collisionFlags;
	dataOut->m_islandTag1 = m_islandTag1;
	dataOut->m_companionId = m_companionId;
	dataOut->m_activationState1 = m_activationState1;
	dataOut->m_deactivationTime = m_deactivationTime;
	dataOut->m_friction = m_friction;
	dataOut->m_rollingFriction = m_rollingFriction;
	dataOut->m_restitution = m_restitution;
	dataOut->m_internalType = m_internalType;
	
	char* name = (char*) serializer->findNameForPointer(this);
	dataOut->m_name = (char*)serializer->getUniquePointer(name);
	if (dataOut->m_name)
	{
		serializer->serializeName(name);
	}
	dataOut->m_hitFraction = m_hitFraction;
	dataOut->m_ccdSweptSphereRadius = m_ccdSweptSphereRadius;
	dataOut->m_ccdMotionThreshold = m_ccdMotionThreshold;
	dataOut->m_checkCollideWith = m_checkCollideWith;

	return btCollisionObjectDataName;
}